

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O3

void cdef_filter_block_internal
               (uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int pri_strength,
               int sec_strength,int dir,int pri_damping,int sec_damping,int coeff_shift,
               int block_width,int block_height,int enable_primary,int enable_secondary)

{
  uint16_t *puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint16_t uVar14;
  int iVar15;
  uint uVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ulong local_a8;
  int shift;
  
  bVar27 = enable_primary != 0;
  bVar28 = enable_secondary != 0;
  if (0 < block_height) {
    iVar21 = 0x1f;
    if (pri_strength != 0) {
      for (; (uint)pri_strength >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    bVar18 = (char)pri_damping - (char)iVar21;
    if (pri_damping < iVar21) {
      bVar18 = 0;
    }
    lVar11 = (long)dir;
    iVar21 = 0x1f;
    if (sec_strength != 0) {
      for (; (uint)sec_strength >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    bVar17 = (char)sec_damping - (char)iVar21;
    local_a8 = 0;
    if (sec_damping < iVar21) {
      bVar17 = 0;
    }
    do {
      if (0 < block_width) {
        uVar10 = 0;
        do {
          lVar9 = uVar10 + local_a8 * 0x90;
          puVar1 = in + lVar9;
          iVar15 = (int)(short)*puVar1;
          lVar12 = 0;
          iVar20 = 0;
          iVar21 = iVar15;
          iVar19 = iVar15;
          bVar2 = true;
          do {
            bVar26 = bVar2;
            if (enable_primary == 0) {
LAB_0038c48b:
              if (enable_secondary != 0) goto LAB_0038c496;
            }
            else {
              lVar4 = (long)*(int *)(lVar11 * 8 + 0x511e00 + lVar12 * 4);
              iVar13 = (int)(short)puVar1[lVar4];
              iVar22 = (int)(short)in[lVar9 - lVar4];
              if (pri_strength == 0) {
                uVar16 = 0;
              }
              else {
                uVar24 = iVar13 - iVar15;
                uVar16 = -uVar24;
                if (0 < (int)uVar24) {
                  uVar16 = uVar24;
                }
                uVar5 = pri_strength - (uVar16 >> (bVar18 & 0x1f));
                if ((int)uVar5 < 1) {
                  uVar5 = 0;
                }
                if (uVar16 < uVar5) {
                  uVar5 = uVar16;
                }
                uVar16 = -uVar5;
                if (-1 < (int)uVar24) {
                  uVar16 = uVar5;
                }
                uVar5 = iVar22 - iVar15;
                uVar24 = -uVar5;
                if (0 < (int)uVar5) {
                  uVar24 = uVar5;
                }
                uVar6 = pri_strength - (uVar24 >> (bVar18 & 0x1f));
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                iVar20 = iVar20 + uVar16 * cdef_pri_taps
                                           [((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0]
                                           [lVar12];
                if (uVar24 < uVar6) {
                  uVar6 = uVar24;
                }
                uVar16 = -uVar6;
                if (-1 < (int)uVar5) {
                  uVar16 = uVar6;
                }
              }
              iVar20 = iVar20 + uVar16 * cdef_pri_taps
                                         [((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0]
                                         [lVar12];
              if (!bVar27 || !bVar28) goto LAB_0038c48b;
              iVar23 = iVar21;
              if (iVar21 <= iVar13) {
                iVar23 = iVar13;
              }
              if (iVar13 == 0x4000) {
                iVar23 = iVar21;
              }
              iVar21 = iVar23;
              if (iVar23 <= iVar22) {
                iVar21 = iVar22;
              }
              if (iVar22 == 0x4000) {
                iVar21 = iVar23;
              }
              if (iVar13 <= iVar19) {
                iVar19 = iVar13;
              }
              if (iVar22 <= iVar19) {
                iVar19 = iVar22;
              }
LAB_0038c496:
              lVar4 = (long)*(int *)(lVar11 * 8 + 0x511e10 + lVar12 * 4);
              iVar22 = (int)(short)puVar1[lVar4];
              iVar25 = (int)(short)in[lVar9 - lVar4];
              iVar23 = (int)(short)puVar1[cdef_directions_padded[lVar11][lVar12]];
              iVar13 = (int)(short)in[lVar9 - cdef_directions_padded[lVar11][lVar12]];
              if (bVar27 && bVar28) {
                iVar3 = iVar21;
                if (iVar21 <= iVar22) {
                  iVar3 = iVar22;
                }
                if (iVar22 == 0x4000) {
                  iVar3 = iVar21;
                }
                iVar21 = iVar3;
                if (iVar3 <= iVar25) {
                  iVar21 = iVar25;
                }
                if (iVar25 == 0x4000) {
                  iVar21 = iVar3;
                }
                iVar3 = iVar21;
                if (iVar21 <= iVar23) {
                  iVar3 = iVar23;
                }
                if (iVar23 == 0x4000) {
                  iVar3 = iVar21;
                }
                iVar21 = iVar3;
                if (iVar3 <= iVar13) {
                  iVar21 = iVar13;
                }
                if (iVar13 == 0x4000) {
                  iVar21 = iVar3;
                }
                if (iVar22 <= iVar19) {
                  iVar19 = iVar22;
                }
                if (iVar25 <= iVar19) {
                  iVar19 = iVar25;
                }
                if (iVar23 <= iVar19) {
                  iVar19 = iVar23;
                }
                if (iVar13 <= iVar19) {
                  iVar19 = iVar13;
                }
              }
              iVar3 = cdef_sec_taps[lVar12];
              if (sec_strength == 0) {
                uVar16 = 0;
              }
              else {
                uVar24 = iVar22 - iVar15;
                uVar16 = -uVar24;
                if (0 < (int)uVar24) {
                  uVar16 = uVar24;
                }
                uVar5 = sec_strength - (uVar16 >> (bVar17 & 0x1f));
                if ((int)uVar5 < 1) {
                  uVar5 = 0;
                }
                if (uVar16 < uVar5) {
                  uVar5 = uVar16;
                }
                uVar16 = -uVar5;
                if (-1 < (int)uVar24) {
                  uVar16 = uVar5;
                }
                uVar5 = iVar25 - iVar15;
                uVar24 = -uVar5;
                if (0 < (int)uVar5) {
                  uVar24 = uVar5;
                }
                uVar6 = sec_strength - (uVar24 >> (bVar17 & 0x1f));
                if ((int)uVar6 < 1) {
                  uVar6 = 0;
                }
                if (uVar24 < uVar6) {
                  uVar6 = uVar24;
                }
                uVar24 = -uVar6;
                if (-1 < (int)uVar5) {
                  uVar24 = uVar6;
                }
                uVar6 = iVar23 - iVar15;
                uVar5 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar5 = uVar6;
                }
                uVar7 = sec_strength - (uVar5 >> (bVar17 & 0x1f));
                if ((int)uVar7 < 1) {
                  uVar7 = 0;
                }
                if (uVar5 < uVar7) {
                  uVar7 = uVar5;
                }
                uVar5 = -uVar7;
                if (-1 < (int)uVar6) {
                  uVar5 = uVar7;
                }
                uVar7 = iVar13 - iVar15;
                uVar6 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar6 = uVar7;
                }
                uVar8 = sec_strength - (uVar6 >> (bVar17 & 0x1f));
                if ((int)uVar8 < 1) {
                  uVar8 = 0;
                }
                iVar20 = uVar5 * iVar3 + uVar24 * iVar3 + iVar20 + uVar16 * iVar3;
                if (uVar6 < uVar8) {
                  uVar8 = uVar6;
                }
                uVar16 = -uVar8;
                if (-1 < (int)uVar7) {
                  uVar16 = uVar8;
                }
              }
              iVar20 = iVar20 + uVar16 * iVar3;
            }
            lVar12 = 1;
            bVar2 = false;
          } while (bVar26);
          uVar14 = *puVar1 + (short)((int)(short)iVar20 + ((int)(short)iVar20 >> 0xf) + 8U >> 4);
          if (bVar27 && bVar28) {
            iVar15 = (int)(short)uVar14;
            if (iVar15 < iVar21) {
              iVar21 = iVar15;
            }
            if (iVar15 < iVar19) {
              iVar21 = iVar19;
            }
            uVar14 = (uint16_t)iVar21;
          }
          if (dst8 == (uint8_t *)0x0) {
            dst16[local_a8 * (long)dstride + uVar10] = uVar14;
          }
          else {
            dst8[uVar10 + local_a8 * (long)dstride] = (uint8_t)uVar14;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)block_width);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != (uint)block_height);
  }
  return;
}

Assistant:

static void cdef_filter_block_internal(
    uint8_t *dst8, uint16_t *dst16, int dstride, const uint16_t *in,
    int pri_strength, int sec_strength, int dir, int pri_damping,
    int sec_damping, int coeff_shift, int block_width, int block_height,
    int enable_primary, int enable_secondary) {
  const int clipping_required = (enable_primary && enable_secondary);
  int i, j, k;
  const int s = CDEF_BSTRIDE;
  const int *pri_taps = cdef_pri_taps[(pri_strength >> coeff_shift) & 1];
  const int *sec_taps = cdef_sec_taps;
  for (i = 0; i < block_height; i++) {
    for (j = 0; j < block_width; j++) {
      int16_t sum = 0;
      int16_t y;
      int16_t x = in[i * s + j];
      int max = x;
      int min = x;
      for (k = 0; k < 2; k++) {
        if (enable_primary) {
          int16_t p0 = in[i * s + j + cdef_directions[dir][k]];
          int16_t p1 = in[i * s + j - cdef_directions[dir][k]];
          sum += pri_taps[k] * constrain(p0 - x, pri_strength, pri_damping);
          sum += pri_taps[k] * constrain(p1 - x, pri_strength, pri_damping);
          if (clipping_required) {
            if (p0 != CDEF_VERY_LARGE) max = AOMMAX(p0, max);
            if (p1 != CDEF_VERY_LARGE) max = AOMMAX(p1, max);
            min = AOMMIN(p0, min);
            min = AOMMIN(p1, min);
          }
        }
        if (enable_secondary) {
          int16_t s0 = in[i * s + j + cdef_directions[dir + 2][k]];
          int16_t s1 = in[i * s + j - cdef_directions[dir + 2][k]];
          int16_t s2 = in[i * s + j + cdef_directions[dir - 2][k]];
          int16_t s3 = in[i * s + j - cdef_directions[dir - 2][k]];
          if (clipping_required) {
            if (s0 != CDEF_VERY_LARGE) max = AOMMAX(s0, max);
            if (s1 != CDEF_VERY_LARGE) max = AOMMAX(s1, max);
            if (s2 != CDEF_VERY_LARGE) max = AOMMAX(s2, max);
            if (s3 != CDEF_VERY_LARGE) max = AOMMAX(s3, max);
            min = AOMMIN(s0, min);
            min = AOMMIN(s1, min);
            min = AOMMIN(s2, min);
            min = AOMMIN(s3, min);
          }
          sum += sec_taps[k] * constrain(s0 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s1 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s2 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s3 - x, sec_strength, sec_damping);
        }
      }
      y = ((int16_t)x + ((8 + sum - (sum < 0)) >> 4));
      if (clipping_required) {
        y = clamp(y, min, max);
      }

      if (dst8)
        dst8[i * dstride + j] = (uint8_t)y;
      else
        dst16[i * dstride + j] = (uint16_t)y;
    }
  }
}